

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

void quantize_row_q8_K_ref(float *x,block_q8_K *y,int64_t k)

{
  float *pfVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  undefined8 uVar8;
  ulong uVar9;
  undefined1 auVar10 [12];
  int j;
  long lVar11;
  int8_t *piVar12;
  long lVar13;
  int8_t *piVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  float fVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  short sVar23;
  float fVar24;
  float fVar30;
  float fVar31;
  undefined1 auVar25 [16];
  short sVar32;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  char cVar3;
  char cVar4;
  char cVar5;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 uVar28;
  undefined2 uVar29;
  undefined4 uVar33;
  undefined6 uVar34;
  
  lVar16 = k + 0xff;
  if (-1 < k) {
    lVar16 = k;
  }
  if (0xff < k) {
    piVar14 = y->qs;
    lVar15 = 0;
    auVar37 = _DAT_0014e7f0;
    auVar38 = _DAT_0014e710;
    do {
      lVar11 = 0;
      fVar18 = 0.0;
      fVar24 = 0.0;
      do {
        fVar17 = ABS(x[lVar11]);
        fVar18 = (float)(~-(uint)(fVar24 < fVar17) & (uint)fVar18 |
                        (uint)x[lVar11] & -(uint)(fVar24 < fVar17));
        if (fVar17 <= fVar24) {
          fVar17 = fVar24;
        }
        lVar11 = lVar11 + 1;
        fVar24 = fVar17;
      } while (lVar11 != 0x100);
      if ((fVar17 != 0.0) || (NAN(fVar17))) {
        fVar18 = -127.0 / fVar18;
        lVar11 = 0;
        do {
          pfVar1 = x + lVar11;
          fVar24 = *pfVar1 * fVar18 + 12582912.0;
          fVar17 = pfVar1[1] * fVar18 + 12582912.0;
          fVar30 = pfVar1[2] * fVar18 + 12582912.0;
          fVar31 = pfVar1[3] * fVar18 + 12582912.0;
          auVar35._0_4_ = -(uint)((int)((uint)fVar24 & 0x7fffff) < auVar37._0_4_);
          auVar35._4_4_ = -(uint)((int)((uint)fVar17 & 0x7fffff) < auVar37._4_4_);
          auVar35._8_4_ = -(uint)((int)((uint)fVar30 & 0x7fffff) < auVar37._8_4_);
          auVar35._12_4_ = -(uint)((int)((uint)fVar31 & 0x7fffff) < auVar37._12_4_);
          auVar36._0_4_ = (uint)fVar24 & auVar35._0_4_;
          auVar36._4_4_ = (uint)fVar17 & auVar35._4_4_;
          auVar36._8_4_ = (uint)fVar30 & auVar35._8_4_;
          auVar36._12_4_ = (uint)fVar31 & auVar35._12_4_;
          auVar36 = (~auVar35 & auVar37 | auVar36) & auVar38;
          sVar23 = auVar36._0_2_;
          cVar2 = (0 < sVar23) * (sVar23 < 0x100) * auVar36[0] - (0xff < sVar23);
          sVar23 = auVar36._2_2_;
          sVar32 = CONCAT11((0 < sVar23) * (sVar23 < 0x100) * auVar36[2] - (0xff < sVar23),cVar2);
          sVar23 = auVar36._4_2_;
          cVar3 = (0 < sVar23) * (sVar23 < 0x100) * auVar36[4] - (0xff < sVar23);
          sVar23 = auVar36._6_2_;
          uVar33 = CONCAT13((0 < sVar23) * (sVar23 < 0x100) * auVar36[6] - (0xff < sVar23),
                            CONCAT12(cVar3,sVar32));
          sVar23 = auVar36._8_2_;
          cVar4 = (0 < sVar23) * (sVar23 < 0x100) * auVar36[8] - (0xff < sVar23);
          sVar23 = auVar36._10_2_;
          uVar34 = CONCAT15((0 < sVar23) * (sVar23 < 0x100) * auVar36[10] - (0xff < sVar23),
                            CONCAT14(cVar4,uVar33));
          sVar23 = auVar36._12_2_;
          cVar5 = (0 < sVar23) * (sVar23 < 0x100) * auVar36[0xc] - (0xff < sVar23);
          sVar7 = auVar36._14_2_;
          sVar23 = (short)((uint)uVar33 >> 0x10);
          sVar6 = (short)((uint6)uVar34 >> 0x20);
          sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar36[0xe] - (0xff < sVar7),
                                   CONCAT16(cVar5,uVar34)) >> 0x30);
          *(uint *)(piVar14 + lVar11) =
               CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar5 - (0xff < sVar7),
                        CONCAT12((0 < sVar6) * (sVar6 < 0x100) * cVar4 - (0xff < sVar6),
                                 CONCAT11((0 < sVar23) * (sVar23 < 0x100) * cVar3 - (0xff < sVar23),
                                          (0 < sVar32) * (sVar32 < 0x100) * cVar2 - (0xff < sVar32))
                                ));
          lVar11 = lVar11 + 4;
        } while (lVar11 != 0x100);
        lVar11 = 0;
        piVar12 = piVar14;
        do {
          iVar19 = 0;
          iVar20 = 0;
          iVar21 = 0;
          iVar22 = 0;
          lVar13 = 0;
          do {
            uVar33 = *(undefined4 *)(piVar12 + lVar13);
            uVar28 = (undefined1)((uint)uVar33 >> 0x18);
            uVar29 = CONCAT11(uVar28,uVar28);
            uVar28 = (undefined1)((uint)uVar33 >> 0x10);
            uVar8 = CONCAT35(CONCAT21(uVar29,uVar28),CONCAT14(uVar28,uVar33));
            uVar28 = (undefined1)((uint)uVar33 >> 8);
            uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar8 >> 0x20),uVar28),uVar28);
            sVar23 = CONCAT11((char)uVar33,(char)uVar33);
            uVar9 = CONCAT62(uVar34,sVar23);
            auVar27._8_4_ = 0;
            auVar27._0_8_ = uVar9;
            auVar27._12_2_ = uVar29;
            auVar27._14_2_ = uVar29;
            uVar29 = (undefined2)((ulong)uVar8 >> 0x20);
            auVar26._12_4_ = auVar27._12_4_;
            auVar26._8_2_ = 0;
            auVar26._0_8_ = uVar9;
            auVar26._10_2_ = uVar29;
            auVar25._10_6_ = auVar26._10_6_;
            auVar25._8_2_ = uVar29;
            auVar25._0_8_ = uVar9;
            uVar29 = (undefined2)uVar34;
            auVar10._4_8_ = auVar25._8_8_;
            auVar10._2_2_ = uVar29;
            auVar10._0_2_ = uVar29;
            iVar19 = iVar19 + ((int)sVar23 >> 8);
            iVar20 = iVar20 + (auVar10._0_4_ >> 0x18);
            iVar21 = iVar21 + (auVar25._8_4_ >> 0x18);
            iVar22 = iVar22 + (auVar26._12_4_ >> 0x18);
            lVar13 = lVar13 + 4;
          } while (lVar13 != 0x10);
          y[lVar15].bsums[lVar11] = (short)iVar22 + (short)iVar20 + (short)iVar21 + (short)iVar19;
          lVar11 = lVar11 + 1;
          piVar12 = piVar12 + 0x10;
        } while (lVar11 != 0x10);
        y[lVar15].d = 1.0 / fVar18;
      }
      else {
        memset(y + lVar15,0,0x104);
        auVar37 = _DAT_0014e7f0;
        auVar38 = _DAT_0014e710;
      }
      x = x + 0x100;
      lVar15 = lVar15 + 1;
      piVar14 = piVar14 + 0x124;
    } while (lVar15 != lVar16 >> 8);
  }
  return;
}

Assistant:

void quantize_row_q8_K_ref(const float * GGML_RESTRICT x, block_q8_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    for (int i = 0; i < nb; i++) {

        float max = 0;
        float amax = 0;
        for (int j = 0; j < QK_K; ++j) {
            float ax = fabsf(x[j]);
            if (ax > amax) {
                amax = ax; max = x[j];
            }
        }
        if (!amax) {
            y[i].d = 0;
            memset(y[i].qs, 0, QK_K);
            x += QK_K;
            continue;
        }
        //const float iscale = -128.f/max;
        // We need this change for IQ2_XXS, else the AVX implementation becomes very awkward
        const float iscale = -127.f/max;
        for (int j = 0; j < QK_K; ++j) {
            int v = nearest_int(iscale*x[j]);
            y[i].qs[j] = MIN(127, v);
        }
        for (int j = 0; j < QK_K/16; ++j) {
            int sum = 0;
            for (int ii = 0; ii < 16; ++ii) {
                sum += y[i].qs[j*16 + ii];
            }
            y[i].bsums[j] = sum;
        }
        y[i].d = 1/iscale;
        x += QK_K;
    }
}